

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathWrapCString(char *val)

{
  xmlXPathObjectPtr pxVar1;
  char *val_local;
  
  pxVar1 = xmlXPathWrapString((xmlChar *)val);
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathWrapCString (char * val) {
    return(xmlXPathWrapString((xmlChar *)(val)));
}